

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O1

float _computeNumberBoolOperation<float>(TokenType type,NumberToken *lhs,NumberToken *rhs)

{
  undefined6 in_register_0000003a;
  uint uVar1;
  float fVar2;
  float fVar3;
  string local_30;
  
  switch((int)CONCAT62(in_register_0000003a,type)) {
  case 0x46:
    fVar2 = pfederc::NumberToken::f32(lhs);
    fVar3 = pfederc::NumberToken::f32(rhs);
    uVar1 = -(uint)(fVar3 == fVar2);
    break;
  case 0x47:
    fVar2 = pfederc::NumberToken::f32(lhs);
    fVar3 = pfederc::NumberToken::f32(rhs);
    uVar1 = -(uint)(fVar3 != fVar2);
    break;
  case 0x48:
    fVar2 = pfederc::NumberToken::f32(lhs);
    fVar3 = pfederc::NumberToken::f32(rhs);
    uVar1 = -(uint)(fVar2 < fVar3);
    break;
  case 0x49:
    fVar2 = pfederc::NumberToken::f32(lhs);
    fVar3 = pfederc::NumberToken::f32(rhs);
    uVar1 = -(uint)(fVar2 <= fVar3);
    break;
  case 0x4a:
    fVar2 = pfederc::NumberToken::f32(lhs);
    fVar3 = pfederc::NumberToken::f32(rhs);
    uVar1 = -(uint)(fVar3 < fVar2);
    break;
  case 0x4b:
    fVar2 = pfederc::NumberToken::f32(lhs);
    fVar3 = pfederc::NumberToken::f32(rhs);
    uVar1 = -(uint)(fVar3 <= fVar2);
    break;
  default:
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Unknown operation","");
    pfederc::fatal("/workspace/llm4binary/github/license_all_cmakelists_25/federlang[P]pfederc/libs/pfederc_syntax/src/syntax_optimizer.cpp"
                   ,0xb3,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return 0.0;
  }
  return (float)(uVar1 & 0x3f800000);
}

Assistant:

static R _computeNumberBoolOperation(TokenType type, const NumberToken &lhs, const NumberToken &rhs) {
	switch (type) {
	case TokenType::TOK_OP_LT:
		return lhs.getNumber<R>() < rhs.getNumber<R>();
	case TokenType::TOK_OP_GT:
		return lhs.getNumber<R>() > rhs.getNumber<R>();
	case TokenType::TOK_OP_LEQ:
		return lhs.getNumber<R>() <= rhs.getNumber<R>();
	case TokenType::TOK_OP_GEQ:
		return lhs.getNumber<R>() >= rhs.getNumber<R>();
	case TokenType::TOK_OP_EQ:
		return lhs.getNumber<R>() == rhs.getNumber<R>();
	case TokenType::TOK_OP_NQ:
		return lhs.getNumber<R>() != rhs.getNumber<R>();
	default:
		fatal(__FILE__, __LINE__, "Unknown operation");
		return 0;
	}
}